

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.cpp
# Opt level: O0

void __thiscall CEntity::~CEntity(CEntity *this)

{
  CGameWorld *this_00;
  IServer *pIVar1;
  CEntity *in_RDI;
  
  in_RDI->_vptr_CEntity = (_func_int **)&PTR__CEntity_00184ad8;
  this_00 = GameWorld(in_RDI);
  CGameWorld::RemoveEntity(this_00,in_RDI);
  pIVar1 = Server((CEntity *)0x11e728);
  (*(pIVar1->super_IInterface)._vptr_IInterface[0xf])(pIVar1,(ulong)(uint)in_RDI->m_ID);
  return;
}

Assistant:

CEntity::~CEntity()
{
	GameWorld()->RemoveEntity(this);
	Server()->SnapFreeID(m_ID);
}